

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  SimpleTag *pSVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  SimpleTag *pSVar11;
  
  iVar4 = this->m_simple_tags_size;
  if (this->m_simple_tags_count < iVar4) {
    return true;
  }
  iVar10 = 1;
  if (iVar4 != 0) {
    iVar10 = iVar4 * 2;
  }
  lVar8 = (long)iVar10 * 0x10;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar9 = lVar8 + 8;
  }
  plVar6 = (long *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
  if (plVar6 == (long *)0x0) {
    return false;
  }
  *plVar6 = (long)iVar10;
  pSVar1 = (SimpleTag *)(plVar6 + 1);
  lVar7 = 0;
  pSVar11 = pSVar1;
  do {
    SimpleTag::SimpleTag(pSVar11);
    lVar7 = lVar7 + -0x10;
    pSVar11 = pSVar11 + 1;
  } while (-lVar7 != lVar8);
  iVar4 = this->m_simple_tags_count;
  pSVar11 = this->m_simple_tags;
  if ((long)iVar4 < 1) {
    if (pSVar11 == (SimpleTag *)0x0) goto LAB_0015920c;
  }
  else {
    lVar8 = 0;
    do {
      puVar2 = (undefined8 *)((long)&pSVar11->m_tag_name + lVar8);
      uVar5 = puVar2[1];
      puVar3 = (undefined8 *)((long)&pSVar1->m_tag_name + lVar8);
      *puVar3 = *puVar2;
      puVar3[1] = uVar5;
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar8);
  }
  if (pSVar11[-1].m_tag_string != (char *)0x0) {
    lVar8 = (long)pSVar11[-1].m_tag_string << 4;
    do {
      SimpleTag::~SimpleTag((SimpleTag *)((long)&pSVar11[-1].m_tag_name + lVar8));
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != 0);
  }
  operator_delete__(&pSVar11[-1].m_tag_string);
LAB_0015920c:
  this->m_simple_tags = pSVar1;
  this->m_simple_tags_size = iVar10;
  return true;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}